

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cc
# Opt level: O0

bool __thiscall lexical::analyse_identifier(lexical *this,iterator *it,Meta *m)

{
  int row;
  int column;
  bool bVar1;
  reference ch;
  Symbol local_b8;
  undefined1 local_90 [8];
  Token t;
  undefined1 local_50 [8];
  string buf;
  int state;
  Meta *m_local;
  iterator *it_local;
  lexical *this_local;
  
  buf.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_50);
  do {
    bVar1 = __gnu_cxx::operator!=(it,&m->end);
    if (!bVar1) {
      this_local._7_1_ = false;
LAB_0011feed:
      std::__cxx11::string::~string((string *)local_50);
      return this_local._7_1_;
    }
    if (buf.field_2._12_4_ == 0) {
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator--(it);
      buf.field_2._12_4_ = 1;
    }
    else if (buf.field_2._12_4_ == 1) {
      ch = __gnu_cxx::
           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(it);
      bVar1 = sutil::is_key(ch,false);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(it);
        std::__cxx11::string::push_back((char)local_50);
      }
      else {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator--(it);
        buf.field_2._12_4_ = 2;
      }
    }
    else if (buf.field_2._12_4_ == 2) {
      row = m->line;
      column = m->column;
      bVar1 = Table::in_key(&this->table,(string *)local_50);
      Token::Token((Token *)local_90,row,column,((byte)~bVar1 & 1) * 3 + 1,(string *)local_50);
      std::vector<Token,_std::allocator<Token>_>::push_back(&this->tokens,(value_type *)local_90);
      if (t.row == 4) {
        Symbol::Symbol(&local_b8,4,(string *)&t.type);
        std::set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_>::insert
                  (&this->symbols,&local_b8);
        Symbol::~Symbol(&local_b8);
      }
      this_local._7_1_ = true;
      Token::~Token((Token *)local_90);
      goto LAB_0011feed;
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(it);
  } while( true );
}

Assistant:

bool lexical::analyse_identifier(string::iterator &it, const Meta &m) {
    int state = 0;
    string buf;
    while (it != m.end) {
        switch (state) {
            case 0: {
                --it;
                state = 1;
                break;
            }
            case 1: {
                if (sutil::is_key(*it))buf.push_back(*it);
                else {
                    --it;
                    state = 2;
                }
                break;
            }
            case 2: {
                Token t(m.line, m.column, table.in_key(buf) ? Token::KEY_WORD : Token::IDENTIFIER, buf);
                tokens.push_back(t);
                if(t.type == Token::IDENTIFIER) {
                    symbols.insert(Symbol(t.type, t.name));
                }
                return true;
            }
        }
        ++it;
    }
    return false;
}